

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

Totals * __thiscall Catch::Totals::operator+=(Totals *this,Totals *other)

{
  Counts *in_RSI;
  Totals *in_RDI;
  
  Counts::operator+=(&in_RDI->assertions,in_RSI);
  Counts::operator+=(&in_RDI->testCases,in_RSI + 1);
  return in_RDI;
}

Assistant:

Totals& Totals::operator += ( Totals const& other ) {
        assertions += other.assertions;
        testCases += other.testCases;
        return *this;
    }